

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonTypeFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 n;
  JsonParse *pCtx;
  int in_ESI;
  u32 i;
  char *zPath;
  JsonParse *p;
  _func_void_void_ptr *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  sqlite3_context *ctx_00;
  
  ctx_00 = (sqlite3_context *)0x0;
  uVar1 = 0xaaaaaaaa;
  pCtx = jsonParseFuncArg((sqlite3_context *)CONCAT44(p._4_4_,p._0_4_),(sqlite3_value *)zPath,i);
  if (pCtx == (JsonParse *)0x0) {
    return;
  }
  if (in_ESI == 2) {
    ctx_00 = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x230815);
    if (ctx_00 == (sqlite3_context *)0x0) goto LAB_002308e3;
    if (*(char *)&ctx_00->pOut != '$') {
      jsonBadPathError(ctx_00,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
      goto LAB_002308e3;
    }
    n = jsonLookupStep((JsonParse *)ctx,argc,(char *)argv,p._4_4_);
    if (0xfffffffc < n) {
      if (n != 0xfffffffe) {
        if (n == 0xfffffffd) {
          jsonBadPathError(ctx_00,(char *)CONCAT44(0xfffffffd,in_stack_ffffffffffffffd0));
        }
        else {
          sqlite3_result_error
                    ((sqlite3_context *)CONCAT44(n,in_stack_ffffffffffffffd0),
                     (char *)in_stack_ffffffffffffffc8,0);
        }
      }
      goto LAB_002308e3;
    }
  }
  else {
    n = 0;
  }
  sqlite3_result_text((sqlite3_context *)pCtx,(char *)ctx_00,n,in_stack_ffffffffffffffc8);
LAB_002308e3:
  jsonParseFree((JsonParse *)0x2308ed);
  return;
}

Assistant:

static void jsonTypeFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath = 0;
  u32 i;

  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  if( argc==2 ){
    zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ) goto json_type_done;
    if( zPath[0]!='$' ){
      jsonBadPathError(ctx, zPath);
      goto json_type_done;
    }
    i = jsonLookupStep(p, 0, zPath+1, 0);
    if( JSON_LOOKUP_ISERROR(i) ){
      if( i==JSON_LOOKUP_NOTFOUND ){
        /* no-op */
      }else if( i==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      goto json_type_done;
    }
  }else{
    i = 0;
  }
  sqlite3_result_text(ctx, jsonbType[p->aBlob[i]&0x0f], -1, SQLITE_STATIC);
json_type_done:
  jsonParseFree(p);
}